

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QByteArray * __thiscall QSslSocketPrivate::peek(QSslSocketPrivate *this,qint64 maxSize)

{
  QRingBufferRef *a;
  QStringBuilder<QByteArray_&,_QByteArray> *pQVar1;
  QStringBuilder<QByteArray_&,_QByteArray> *in_RDX;
  QRingBufferRef *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray ret;
  QByteArray *in_stack_ffffffffffffff58;
  QByteArray *in_stack_ffffffffffffff60;
  QByteArray *b;
  QByteArray *data;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_58 [56];
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RSI + 0x270) == 0) && (((byte)in_RSI[0x274] & 1) == 0)) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    data = in_RDI;
    QByteArray::QByteArray((QByteArray *)0x3a724b);
    QByteArray::reserve(in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    a = in_RSI + 0x90;
    QByteArray::data(in_stack_ffffffffffffff60);
    QIODevicePrivate::QRingBufferRef::peek(in_RSI,(char *)data,(qint64)in_RDI,(qint64)a);
    QByteArray::resize((longlong)&local_20);
    pQVar1 = (QStringBuilder<QByteArray_&,_QByteArray> *)QByteArray::size(&local_20);
    if (pQVar1 == in_RDX) {
      QByteArray::QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else if (*(long *)(in_RSI + 0x3f8) == 0) {
      QByteArray::QByteArray((QByteArray *)0x3a7379);
    }
    else {
      b = *(QByteArray **)(in_RSI + 0x3f8);
      QByteArray::size(&local_20);
      QIODevice::peek((longlong)local_58);
      ::operator+((QByteArray *)a,b);
      ::QStringBuilder::operator_cast_to_QByteArray(in_RDX);
      QStringBuilder<QByteArray_&,_QByteArray>::~QStringBuilder
                ((QStringBuilder<QByteArray_&,_QByteArray> *)0x3a735b);
      QByteArray::~QByteArray((QByteArray *)0x3a7365);
    }
    QByteArray::~QByteArray((QByteArray *)0x3a738e);
    in_RDI = data;
  }
  else {
    QIODevicePrivate::peek((longlong)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QSslSocketPrivate::peek(qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        QByteArray ret;
        ret.reserve(maxSize);
        ret.resize(buffer.peek(ret.data(), maxSize, transactionPos));
        if (ret.size() == maxSize)
            return ret;
        //peek at data in the plain socket
        if (plainSocket)
            return ret + plainSocket->peek(maxSize - ret.size());

        return QByteArray();
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(maxSize);
    }
}